

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string outputFileName;
  Args a;
  FastText fasttext;
  ofstream ofs;
  string local_430;
  string local_410;
  Args local_3f0;
  FastText local_2c8;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  ::fasttext::Args::Args(&local_3f0);
  ::fasttext::Args::parseArgs(&local_3f0,args);
  ::fasttext::FastText::FastText(&local_2c8);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_410,local_3f0.output._M_dataplus._M_p,
             local_3f0.output._M_dataplus._M_p + local_3f0.output._M_string_length);
  std::__cxx11::string::append((char *)&local_410);
  std::ofstream::ofstream(&local_220,(string *)&local_410,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::ofstream::close();
    ::fasttext::FastText::train(&local_2c8,&local_3f0);
    ::fasttext::FastText::saveModel(&local_2c8,&local_410);
    paVar1 = &local_430.field_2;
    local_430._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,local_3f0.output._M_dataplus._M_p,
               local_3f0.output._M_dataplus._M_p + local_3f0.output._M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    ::fasttext::FastText::saveVectors(&local_2c8,&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar1) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if (local_3f0.saveOutput == true) {
      local_430._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_430,local_3f0.output._M_dataplus._M_p,
                 local_3f0.output._M_dataplus._M_p + local_3f0.output._M_string_length);
      std::__cxx11::string::append((char *)&local_430);
      ::fasttext::FastText::saveOutput(&local_2c8,&local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != paVar1) {
        operator_delete(local_430._M_dataplus._M_p);
      }
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    ::fasttext::FastText::~FastText(&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.pretrainedVectors._M_dataplus._M_p != &local_3f0.pretrainedVectors.field_2) {
      operator_delete(local_3f0.pretrainedVectors._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.id._M_dataplus._M_p != &local_3f0.id.field_2) {
      operator_delete(local_3f0.id._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.label._M_dataplus._M_p != &local_3f0.label.field_2) {
      operator_delete(local_3f0.label._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.weights._M_dataplus._M_p != &local_3f0.weights.field_2) {
      operator_delete(local_3f0.weights._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.output._M_dataplus._M_p != &local_3f0.output.field_2) {
      operator_delete(local_3f0.output._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.input._M_dataplus._M_p != &local_3f0.input.field_2) {
      operator_delete(local_3f0.input._M_dataplus._M_p);
    }
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_430,&local_410," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)&local_430);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  FastText fasttext;
  std::string outputFileName(a.output + ".bin");
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  fasttext.train(a);
  fasttext.saveModel(outputFileName);
  fasttext.saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext.saveOutput(a.output + ".output");
  }
}